

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ClassRandomizeFunction::ClassRandomizeFunction(ClassRandomizeFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Randomize,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b2a00;
  (this->super_SystemSubroutine).withClauseMode = Randomize;
  return;
}

Assistant:

ClassRandomizeFunction() :
        SystemSubroutine(KnownSystemName::Randomize, SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Randomize;
    }